

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O3

bool __thiscall
boost::detail::function::basic_vtable0<void>::
assign_to<boost::_bi::bind_t<void,boost::_mfi::mf0<void,boost::unit_test::test_unit_fixture>,boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>>>>>
          (undefined8 param_1,undefined8 *f,undefined8 *functor)

{
  undefined8 uVar1;
  sp_counted_base *psVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  shared_count local_30 [2];
  
  uVar3 = *f;
  uVar4 = f[1];
  uVar1 = f[2];
  psVar2 = (sp_counted_base *)f[3];
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    psVar2->use_count_ = psVar2->use_count_ + 1;
    UNLOCK();
  }
  local_30[0].pi_ = psVar2;
  puVar5 = (undefined8 *)operator_new(0x20);
  *puVar5 = uVar3;
  puVar5[1] = uVar4;
  puVar5[2] = uVar1;
  puVar5[3] = psVar2;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    psVar2->use_count_ = psVar2->use_count_ + 1;
    UNLOCK();
  }
  *functor = puVar5;
  shared_count::~shared_count(local_30);
  return true;
}

Assistant:

bool
        assign_to(FunctionObj f, function_buffer& functor, function_obj_tag) const
        {
          if (!boost::detail::function::has_empty_target(boost::addressof(f))) {
            assign_functor(f, functor,
                           mpl::bool_<(function_allows_small_object_optimization<FunctionObj>::value)>());
            return true;
          } else {
            return false;
          }
        }